

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  int iVar5;
  undefined8 uVar6;
  seqStore_t *psVar7;
  uint uVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  seqDef *psVar12;
  uint uVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  long lVar17;
  int *ip;
  int *piVar18;
  BYTE *litEnd;
  int *piVar19;
  U32 UVar20;
  ulong uVar21;
  BYTE *litLimit_w;
  int *iend;
  int iVar22;
  U32 local_b0;
  U32 local_ac;
  size_t local_a0;
  size_t offsetFound;
  seqStore_t *local_88;
  BYTE *local_80;
  BYTE *local_78;
  int *local_70;
  ulong local_68;
  BYTE *local_60;
  ZSTD_matchState_t *local_58;
  int *local_50;
  BYTE *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  pBVar3 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  local_80 = pBVar3 + uVar2;
  local_ac = *rep;
  pZVar4 = ms->dictMatchState;
  local_78 = (pZVar4->window).nextSrc;
  local_60 = (pZVar4->window).base;
  local_40 = local_60 + (pZVar4->window).dictLimit;
  local_68 = (ulong)(((int)local_60 - (int)local_78) + uVar2);
  local_b0 = rep[1];
  ip = (int *)((ulong)((((int)src - (int)local_40) - (int)local_80) + (int)local_78 == 0) +
              (long)src);
  local_48 = local_60 + -local_68;
  iEnd = (BYTE *)(srcSize + (long)src);
  local_70 = (int *)((long)src + (srcSize - 8));
  local_50 = (int *)((long)src + (srcSize - 0x20));
  local_88 = seqStore;
  local_58 = ms;
  local_38 = rep;
  do {
    while( true ) {
      if (local_70 <= ip) {
        *local_38 = local_ac;
        local_38[1] = local_b0;
        return (long)iEnd - (long)src;
      }
      iVar22 = (int)pBVar3;
      uVar8 = (((int)ip - iVar22) - local_ac) + 1;
      piVar19 = (int *)(pBVar3 + uVar8);
      if (uVar8 < uVar2) {
        piVar19 = (int *)(local_60 + (uVar8 - (int)local_68));
      }
      if ((uVar8 - uVar2 < 0xfffffffd) && (*piVar19 == *(int *)((long)ip + 1))) {
        pBVar14 = iEnd;
        if (uVar8 < uVar2) {
          pBVar14 = local_78;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)(piVar19 + 1),iEnd,pBVar14,local_80);
        uVar21 = sVar9 + 4;
      }
      else {
        uVar21 = 0;
      }
      offsetFound = 999999999;
      sVar9 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS(local_58,(BYTE *)ip,iEnd,&offsetFound);
      uVar11 = uVar21;
      if (uVar21 < sVar9) {
        uVar11 = sVar9;
      }
      if (3 < uVar11) break;
      ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
    }
    sVar10 = offsetFound;
    piVar19 = ip;
    if (sVar9 <= uVar21) {
      sVar10 = 0;
      piVar19 = (int *)((long)ip + 1);
    }
LAB_00586dbe:
    do {
      iend = piVar19;
      sVar9 = uVar11;
      local_a0 = sVar10;
      piVar18 = ip;
      if (local_70 <= piVar18) break;
      ip = (int *)((long)piVar18 + 1);
      uVar8 = ((int)ip - iVar22) - local_ac;
      piVar19 = (int *)(pBVar3 + uVar8);
      if (uVar8 < uVar2) {
        piVar19 = (int *)(local_60 + (uVar8 - (int)local_68));
      }
      if ((uVar8 - uVar2 < 0xfffffffd) && (*piVar19 == *ip)) {
        pBVar14 = iEnd;
        if (uVar8 < uVar2) {
          pBVar14 = local_78;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar18 + 5),(BYTE *)(piVar19 + 1),iEnd,pBVar14,local_80)
        ;
        if (sVar10 < 0xfffffffffffffffc) {
          uVar13 = (int)local_a0 + 1;
          uVar8 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          if ((int)((uVar8 ^ 0x1f) + (int)sVar9 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
            local_a0 = 0;
            sVar9 = sVar10 + 4;
            iend = ip;
          }
        }
      }
      offsetFound = 999999999;
      uVar11 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS(local_58,(BYTE *)ip,iEnd,&offsetFound);
      if (3 < uVar11) {
        uVar13 = (int)local_a0 + 1;
        uVar8 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar13 = (int)offsetFound + 1;
        iVar5 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        sVar10 = offsetFound;
        piVar19 = ip;
        if ((int)((uVar8 ^ 0x1f) + (int)sVar9 * 4 + -0x1b) < (int)uVar11 * 4 - iVar5)
        goto LAB_00586dbe;
      }
      if (local_70 <= ip) break;
      ip = (int *)((long)piVar18 + 2);
      uVar8 = ((int)ip - iVar22) - local_ac;
      piVar19 = (int *)(pBVar3 + uVar8);
      if (uVar8 < uVar2) {
        piVar19 = (int *)(local_60 + (uVar8 - (int)local_68));
      }
      if ((uVar8 - uVar2 < 0xfffffffd) && (*piVar19 == *ip)) {
        pBVar14 = iEnd;
        if (uVar8 < uVar2) {
          pBVar14 = local_78;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar18 + 6),(BYTE *)(piVar19 + 1),iEnd,pBVar14,local_80)
        ;
        if (sVar10 < 0xfffffffffffffffc) {
          uVar13 = (int)local_a0 + 1;
          uVar8 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          if ((int)((uVar8 ^ 0x1f) + (int)sVar9 * 4 + -0x1e) < (int)(sVar10 + 4) * 4) {
            local_a0 = 0;
            sVar9 = sVar10 + 4;
            iend = ip;
          }
        }
      }
      offsetFound = 999999999;
      uVar11 = ZSTD_BtFindBestMatch_dictMatchState_selectMLS(local_58,(BYTE *)ip,iEnd,&offsetFound);
      if (uVar11 < 4) break;
      uVar13 = (int)local_a0 + 1;
      uVar8 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar13 = (int)offsetFound + 1;
      iVar5 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      sVar10 = offsetFound;
      piVar19 = ip;
    } while ((int)((uVar8 ^ 0x1f) + (int)sVar9 * 4 + -0x18) < (int)uVar11 * 4 - iVar5);
    psVar7 = local_88;
    if (local_a0 == 0) {
      UVar20 = 1;
    }
    else {
      pBVar15 = (BYTE *)((long)iend + (-(long)pBVar3 - local_a0) + -0xfffffffe);
      pBVar16 = pBVar3;
      pBVar14 = local_80;
      if ((uint)pBVar15 < uVar2) {
        pBVar16 = local_48;
        pBVar14 = local_40;
      }
      pBVar16 = pBVar16 + ((ulong)pBVar15 & 0xffffffff);
      for (; ((src < iend && (pBVar14 < pBVar16)) && (*(BYTE *)((long)iend + -1) == pBVar16[-1]));
          iend = (int *)((long)iend + -1)) {
        pBVar16 = pBVar16 + -1;
        sVar9 = sVar9 + 1;
      }
      UVar20 = (int)local_a0 + 1;
      local_b0 = local_ac;
      local_ac = (int)local_a0 - 2;
    }
    uVar21 = (long)iend - (long)src;
    pBVar14 = local_88->lit;
    if (local_50 < iend) {
      ZSTD_safecopyLiterals(pBVar14,(BYTE *)src,(BYTE *)iend,(BYTE *)local_50);
LAB_0058706c:
      psVar7->lit = psVar7->lit + uVar21;
      psVar12 = psVar7->sequences;
      if (0xffff < uVar21) {
        psVar7->longLengthType = ZSTD_llt_literalLength;
        psVar7->longLengthPos = (U32)((ulong)((long)psVar12 - (long)psVar7->sequencesStart) >> 3);
      }
    }
    else {
      uVar6 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar14 = *src;
      *(undefined8 *)(pBVar14 + 8) = uVar6;
      pBVar14 = local_88->lit;
      if (0x10 < uVar21) {
        uVar6 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar14 + 0x18) = uVar6;
        if (0x20 < (long)uVar21) {
          lVar17 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar17 + 0x20);
            uVar6 = puVar1[1];
            pBVar16 = pBVar14 + lVar17 + 0x20;
            *(undefined8 *)pBVar16 = *puVar1;
            *(undefined8 *)(pBVar16 + 8) = uVar6;
            puVar1 = (undefined8 *)((long)src + lVar17 + 0x30);
            uVar6 = puVar1[1];
            *(undefined8 *)(pBVar16 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar16 + 0x18) = uVar6;
            lVar17 = lVar17 + 0x20;
          } while (pBVar16 + 0x20 < pBVar14 + uVar21);
        }
        goto LAB_0058706c;
      }
      local_88->lit = pBVar14 + uVar21;
      psVar12 = local_88->sequences;
    }
    piVar19 = local_50;
    psVar12->litLength = (U16)uVar21;
    psVar12->offset = UVar20;
    if (0xffff < sVar9 - 3) {
      psVar7->longLengthType = ZSTD_llt_matchLength;
      psVar7->longLengthPos = (U32)((ulong)((long)psVar12 - (long)psVar7->sequencesStart) >> 3);
    }
    psVar12->matchLength = (U16)(sVar9 - 3);
    psVar7->sequences = psVar12 + 1;
    UVar20 = local_b0;
    for (ip = (int *)((long)iend + sVar9); local_b0 = UVar20, src = ip, ip <= local_70;
        ip = (int *)((long)ip + sVar9 + 4)) {
      uVar8 = ((int)ip - iVar22) - local_b0;
      pBVar14 = pBVar3;
      if (uVar8 < uVar2) {
        pBVar14 = local_48;
      }
      if ((0xfffffffc < uVar8 - uVar2) || (*(int *)(pBVar14 + uVar8) != *ip)) break;
      pBVar16 = iEnd;
      if (uVar8 < uVar2) {
        pBVar16 = local_78;
      }
      sVar9 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar14 + uVar8) + 4),iEnd,pBVar16,
                         local_80);
      pBVar14 = local_88->lit;
      if (piVar19 < ip) {
        ZSTD_safecopyLiterals(pBVar14,(BYTE *)ip,(BYTE *)ip,(BYTE *)piVar19);
      }
      else {
        uVar6 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar14 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar14 + 8) = uVar6;
      }
      psVar12 = local_88->sequences;
      psVar12->litLength = 0;
      psVar12->offset = 1;
      if (0xffff < sVar9 + 1) {
        local_88->longLengthType = ZSTD_llt_matchLength;
        local_88->longLengthPos =
             (U32)((ulong)((long)psVar12 - (long)local_88->sequencesStart) >> 3);
      }
      psVar12->matchLength = (U16)(sVar9 + 1);
      local_88->sequences = psVar12 + 1;
      UVar20 = local_ac;
      local_ac = local_b0;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_dictMatchState);
}